

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O2

void atomtab_d(disctx *ctx,ull *a,ull *m,void *v)

{
  ulong uVar1;
  ulong uVar2;
  code *pcVar3;
  int iVar4;
  long lVar5;
  
  uVar1 = *a;
  do {
    uVar2 = *(ulong *)((long)v + 8);
    if ((uVar2 & uVar1) == *v) {
      iVar4 = var_ok((int)*(ulong *)((long)v + 0x310),*(int *)((long)v + 0x314),ctx->varinfo);
      if (iVar4 != 0) {
        *m = *m | uVar2;
        for (lVar5 = 0x20; lVar5 != 800; lVar5 = lVar5 + 0x18) {
          pcVar3 = *(code **)((long)v + lVar5 + -8);
          if (pcVar3 != (code *)0x0) {
            (*pcVar3)(ctx,a,m,*(undefined8 *)((long)v + lVar5));
          }
        }
        return;
      }
    }
    v = (void *)((long)v + 0x318);
  } while( true );
}

Assistant:

void atomtab_d DPROTO {
	const struct insn *tab = v;
	int i;
	while ((a[0]&tab->mask) != tab->val || !var_ok(tab->fmask, tab->ptype, ctx->varinfo))
		tab++;
	m[0] |= tab->mask;
	for (i = 0; i < ARRAY_SIZE(tab->atoms); i++)
		if (tab->atoms[i].fun_dis)
			tab->atoms[i].fun_dis (ctx, a, m, tab->atoms[i].arg);
}